

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

vector<State,_std::allocator<State>_> * __thiscall
Problem::fringeExpander
          (vector<State,_std::allocator<State>_> *__return_storage_ptr__,Problem *this,
          vector<State,_std::allocator<State>_> *fringe,int fringeSize,int expanderCode)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  vector<State,_std::allocator<State>_> *this_00;
  vector<State,_std::allocator<State>_> *expandedfringe;
  vector<State,_std::allocator<State>_> newfringe;
  vector<State,_std::allocator<State>_> neighbours;
  vector<State,_std::allocator<State>_> local_c8;
  State local_b0;
  vector<State,_std::allocator<State>_> local_88;
  vector<State,_std::allocator<State>_> local_70;
  State local_58;
  
  std::vector<State,_std::allocator<State>_>::vector(&local_c8,fringe);
  poVar2 = std::operator<<((ostream *)&std::cout,"Expanding fringe");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (pSVar3 = (fringe->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 < (fringe->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
               super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    State::State(&local_58,pSVar3);
    getNeighbours((vector<State,_std::allocator<State>_> *)&local_b0,this,&local_58);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
    std::vector<State,std::allocator<State>>::
    insert<__gnu_cxx::__normal_iterator<State*,std::vector<State,std::allocator<State>>>,void>
              ((vector<State,std::allocator<State>> *)&local_c8,
               (const_iterator)
               local_c8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>)
               local_b0.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<State_*,_std::vector<State,_std::allocator<State>_>_>)
               local_b0.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_b0);
  }
  for (pSVar3 = local_c8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 < local_c8.super__Vector_base<State,_std::allocator<State>_>._M_impl.
               super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    State::State(&local_b0,pSVar3);
    bVar1 = State::isValid(&local_b0);
    if (bVar1) {
      std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_CompareState>::push
                (&this->validStateStore,&local_b0);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
  }
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (expanderCode == 0) {
    std::vector<State,_std::allocator<State>_>::vector(&local_70,&local_c8);
    localGreedyExpander((vector<State,_std::allocator<State>_> *)&local_b0,this,&local_70,fringeSize
                       );
    std::vector<State,_std::allocator<State>_>::_M_move_assign(__return_storage_ptr__,&local_b0);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_b0);
    this_00 = &local_70;
  }
  else {
    std::vector<State,_std::allocator<State>_>::vector(&local_88,&local_c8);
    localGreedyExpander((vector<State,_std::allocator<State>_> *)&local_b0,this,&local_88,fringeSize
                       );
    std::vector<State,_std::allocator<State>_>::_M_move_assign(__return_storage_ptr__,&local_b0);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_b0);
    this_00 = &local_88;
  }
  std::vector<State,_std::allocator<State>_>::~vector(this_00);
  std::vector<State,_std::allocator<State>_>::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

vector<State> Problem::fringeExpander(vector<State> fringe, int fringeSize, int expanderCode) {
    // Initialize new fringe with old fringe
    vector<State> newfringe(fringe);
    cout<<"Expanding fringe"<<endl;

    // TODO: improve method to form new fringe without using enormous space each time
    // Algorithm has much less running time for fringeSize=1 -> Re-implement
    for (auto it = fringe.begin(); it < fringe.end(); it++) {
        vector<State> neighbours = getNeighbours(*it);
        newfringe.insert(newfringe.end(), neighbours.begin(), neighbours.end());
    }

    // Update validStateStore if valid state found among neighbours
    for (auto it = newfringe.begin(); it < newfringe.end(); it++) {
        State state = *it;
        if (state.isValid()) {
            validStateStore.push(state);
        }
        if (validStateStore.size() > validStoreSize) {
            // validStateStore.pop();                  //Question: Won't this remove the best states???????
        }
    }

    // Carry out operation according to expanderCode
    /*
     * Codes for expander functions
     * 0 : greedy expander
     */
    vector<State> expandedfringe;
    switch (expanderCode) {
        case 0:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;

        default:
            expandedfringe = localGreedyExpander(newfringe, fringeSize);
            break;
    }

    return expandedfringe;
}